

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.cpp
# Opt level: O1

void test_std_intersect<std::vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>>
               (vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *values)

{
  pointer pvVar1;
  pointer plVar2;
  pointer plVar3;
  pointer plVar4;
  pointer plVar5;
  pointer plVar6;
  clock_t cVar7;
  clock_t cVar8;
  ostream *poVar9;
  pointer pvVar10;
  value_type intersected;
  value_type result;
  vector<long,_std::allocator<long>_> local_50;
  vector<long,_std::allocator<long>_> local_38;
  
  std::vector<long,_std::allocator<long>_>::vector
            (&local_50,
             (values->
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  cVar7 = clock();
  pvVar1 = (values->
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar10 = (values->
            super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start + 1;
  if (pvVar10 != pvVar1) {
    do {
      local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<long,_std::allocator<long>_>::reserve
                (&local_38,
                 ((long)(pvVar10->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar10->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 3) +
                 ((long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3));
      std::
      __set_intersection<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long_const*,std::vector<long,std::allocator<long>>>,std::back_insert_iterator<std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (pvVar10->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start,
                 (pvVar10->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_finish,&local_38);
      plVar6 = local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      plVar5 = local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      plVar4 = local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar3 = local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      plVar2 = local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_38.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = plVar4;
      local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = plVar5;
      local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = plVar6;
      if (plVar2 != (pointer)0x0) {
        operator_delete(plVar2,(long)plVar3 - (long)plVar2);
      }
      pvVar10 = pvVar10 + 1;
    } while (pvVar10 != pvVar1);
  }
  cVar8 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"std::set_intersection: ",0x17);
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
  poVar9 = std::ostream::_M_insert<double>((double)(cVar8 - cVar7) / 1000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  if (local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_std_intersect (const Container & values)
{
    typename Container::value_type intersected(values.front());

    clock_t intersect_time = clock();
    for (const auto & row: boost::make_iterator_range(std::next(values.begin()), values.end()))
    {
        typename Container::value_type result;
        result.reserve(intersected.size() + row.size());
        std::set_intersection(intersected.begin(), intersected.end(), row.begin(), row.end(), std::back_inserter(result));
        std::swap(result, intersected);
    }
    intersect_time = clock() - intersect_time;

    std::cout << "std::set_intersection: " << intersected.size() << std::endl;
    std::cout << "\t" << static_cast<double>(intersect_time) / CLOCKS_PER_SEC << std::endl;
    std::cout << std::endl;
}